

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::calculateabovepoint4(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  point pdVar1;
  tetgenmesh *this_00;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 in_XMM5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double n2 [3];
  double n1 [3];
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  this_00 = this;
  facenormal(this,pa,pb,pc,&local_48,1,(double *)0x0);
  facenormal(this_00,pa,pb,pd,&local_68,1,(double *)0x0);
  auVar6._0_8_ = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  auVar6._8_8_ = local_58 * local_58 + local_68 * local_68 + local_60 * local_60;
  auVar6 = sqrtpd(in_XMM5,auVar6);
  dVar4 = auVar6._0_8_;
  dVar7 = auVar6._8_8_;
  dVar5 = dVar4;
  if (dVar4 <= dVar7) {
    dVar5 = dVar7;
  }
  pdVar2 = &local_68;
  if (dVar7 < dVar4) {
    pdVar2 = &local_48;
  }
  dVar3 = (double)(~-(ulong)(dVar7 < dVar4) & (ulong)local_68 |
                  (ulong)local_48 & -(ulong)(dVar7 < dVar4)) / dVar5;
  *pdVar2 = dVar3;
  if (dVar4 <= dVar7) {
    local_40 = local_60;
  }
  pdVar2[1] = local_40 / dVar5;
  if (dVar4 <= dVar7) {
    local_38 = local_58;
  }
  pdVar2[2] = local_38 / dVar5;
  dVar4 = *pb - *pa;
  dVar4 = SQRT((pb[2] - pa[2]) * (pb[2] - pa[2]) + dVar4 * dVar4 + (pb[1] - pa[1]) * (pb[1] - pa[1])
              );
  pdVar1 = this->dummypoint;
  *pdVar1 = dVar3 * dVar4 + *pa;
  pdVar1[1] = (local_40 / dVar5) * dVar4 + pa[1];
  pdVar1[2] = (local_38 / dVar5) * dVar4 + pa[2];
  return;
}

Assistant:

void tetgenmesh::calculateabovepoint4(point pa, point pb, point pc, point pd)
{
  REAL n1[3], n2[3], *norm;
  REAL len, len1, len2;

  // Select a base.
  facenormal(pa, pb, pc, n1, 1, NULL);
  len1 = sqrt(dot(n1, n1));
  facenormal(pa, pb, pd, n2, 1, NULL);
  len2 = sqrt(dot(n2, n2));
  if (len1 > len2) {
    norm = n1;
    len = len1;
  } else {
    norm = n2;
    len = len2;
  }
  norm[0] /= len;
  norm[1] /= len;
  norm[2] /= len;
  len = distance(pa, pb);
  dummypoint[0] = pa[0] + len * norm[0];
  dummypoint[1] = pa[1] + len * norm[1];
  dummypoint[2] = pa[2] + len * norm[2];
}